

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manageonesuperblock.h
# Opt level: O0

SuperblockType * __thiscall
Hoard::
ManageOneSuperblock<Hoard::EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>_>
::get(ManageOneSuperblock<Hoard::EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>_>
      *this)

{
  long in_RDI;
  SuperblockType *s;
  undefined8 local_8;
  
  if (*(long *)(in_RDI + 0x50) == 0) {
    local_8 = EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
              ::get(&this->
                     super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
                   );
  }
  else {
    local_8 = *(SuperblockType **)(in_RDI + 0x50);
    *(undefined8 *)(in_RDI + 0x50) = 0;
  }
  return local_8;
}

Assistant:

SuperblockType * get() {
      if (likely(_current)) {
	SuperblockType * s = _current;
	_current = nullptr;
	return s;
      } else {
	// There's none cached, so just get one from the superheap.
	return SuperHeap::get();
      }
    }